

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::CopyBLAS(DeviceContextVkImpl *this,CopyBLASAttribs *Attribs)

{
  Uint32 *pUVar1;
  atomic<unsigned_int> *paVar2;
  BottomLevelASVkImpl *BLAS;
  BottomLevelASVkImpl *BLAS_00;
  VkCopyAccelerationStructureModeKHR VVar3;
  VkCopyAccelerationStructureInfoKHR Info;
  VkCopyAccelerationStructureInfoKHR local_58;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  BLAS = (BottomLevelASVkImpl *)Attribs->pSrc;
  if (BLAS != (BottomLevelASVkImpl *)0x0) {
    CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>((IBottomLevelAS *)BLAS)
    ;
  }
  BLAS_00 = (BottomLevelASVkImpl *)Attribs->pDst;
  if (BLAS_00 != (BottomLevelASVkImpl *)0x0) {
    CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
              ((IBottomLevelAS *)BLAS_00);
  }
  BottomLevelASBase<Diligent::EngineVkImplTraits>::CopyGeometryDescription
            ((BottomLevelASBase<Diligent::EngineVkImplTraits> *)BLAS_00,
             (BottomLevelASBase<Diligent::EngineVkImplTraits> *)BLAS);
  (BLAS_00->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_GeometryCount =
       (BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_GeometryCount;
  local_58.pNext = (void *)0x0;
  local_58.mode = VK_COPY_ACCELERATION_STRUCTURE_MODE_CLONE_KHR;
  local_58._36_4_ = 0;
  local_58.sType = VK_STRUCTURE_TYPE_COPY_ACCELERATION_STRUCTURE_INFO_KHR;
  local_58._4_4_ = 0;
  local_58.src = (BLAS->m_VulkanBLAS).m_VkObject;
  local_58.dst = (BLAS_00->m_VulkanBLAS).m_VkObject;
  VVar3 = CopyASModeToVkCopyAccelerationStructureMode(Attribs->Mode);
  local_58.mode = VVar3;
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBLASState
            (this,BLAS,Attribs->SrcTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
             "Copy BottomLevelAS (DeviceContextVkImpl::CopyBLAS)");
  TransitionOrVerifyBLASState
            (this,BLAS_00,Attribs->DstTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Copy BottomLevelAS (DeviceContextVkImpl::CopyBLAS)");
  VulkanUtilities::VulkanCommandBuffer::CopyAccelerationStructure(&this->m_CommandBuffer,&local_58);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  LOCK();
  paVar2 = &(BLAS_00->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_DvpVersion;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void DeviceContextVkImpl::CopyBLAS(const CopyBLASAttribs& Attribs)
{
    TDeviceContextBase::CopyBLAS(Attribs, 0);

    BottomLevelASVkImpl* pSrcVk = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pSrc);
    BottomLevelASVkImpl* pDstVk = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pDst);

    // Dst BLAS description has specified CompactedSize, but doesn't have specified pTriangles and pBoxes.
    // We should copy geometries because it required for SBT to map geometry name to hit group.
    pDstVk->CopyGeometryDescription(*pSrcVk);
    pDstVk->SetActualGeometryCount(pSrcVk->GetActualGeometryCount());

    VkCopyAccelerationStructureInfoKHR Info = {};

    Info.sType = VK_STRUCTURE_TYPE_COPY_ACCELERATION_STRUCTURE_INFO_KHR;
    Info.src   = pSrcVk->GetVkBLAS();
    Info.dst   = pDstVk->GetVkBLAS();
    Info.mode  = CopyASModeToVkCopyAccelerationStructureMode(Attribs.Mode);

    EnsureVkCmdBuffer();

    const char* OpName = "Copy BottomLevelAS (DeviceContextVkImpl::CopyBLAS)";
    TransitionOrVerifyBLASState(*pSrcVk, Attribs.SrcTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
    TransitionOrVerifyBLASState(*pDstVk, Attribs.DstTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);

    m_CommandBuffer.CopyAccelerationStructure(Info);
    ++m_State.NumCommands;

#ifdef DILIGENT_DEVELOPMENT
    pDstVk->DvpUpdateVersion();
#endif
}